

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O2

void __thiscall
TasGrid::GridGlobal::evaluateBatchGPUtempl<double>
          (GridGlobal *this,double *gpu_x,int cpu_num_x,double *gpu_y)

{
  int dim2;
  GpuVector<double> gpu_basis;
  GpuVector<double> local_40;
  
  loadGpuValues<double>(this);
  dim2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  GpuVector<double>::GpuVector
            (&local_40,(this->super_BaseCanonicalGrid).acceleration,cpu_num_x,dim2);
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x16])
            (this,gpu_x,(ulong)(uint)cpu_num_x,local_40.gpu_data);
  TasGpu::denseMultiply<double>
            ((this->super_BaseCanonicalGrid).acceleration,
             (this->super_BaseCanonicalGrid).num_outputs,cpu_num_x,dim2,1.0,
             &((this->gpu_cache)._M_t.
               super___uniq_ptr_impl<TasGrid::CudaGlobalData<double>,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_TasGrid::CudaGlobalData<double>_*,_std::default_delete<TasGrid::CudaGlobalData<double>_>_>
               .super__Head_base<0UL,_TasGrid::CudaGlobalData<double>_*,_false>._M_head_impl)->
              values,&local_40,0.0,gpu_y);
  GpuVector<double>::~GpuVector(&local_40);
  return;
}

Assistant:

void GridGlobal::evaluateBatchGPUtempl(T const gpu_x[], int cpu_num_x, T gpu_y[]) const{
    loadGpuValues<T>();
    int num_points = points.getNumIndexes();

    GpuVector<T> gpu_basis(acceleration, cpu_num_x, num_points);
    evaluateHierarchicalFunctionsGPU(gpu_x, cpu_num_x, gpu_basis.data());
    TasGpu::denseMultiply(acceleration, num_outputs, cpu_num_x, num_points, 1.0, getGpuCache<T>()->values, gpu_basis, 0.0, gpu_y);
}